

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O1

void __thiscall cppcms::http::cookie::cookie(cookie *this)

{
  (this->d).ptr_ = (_data *)0x0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  (this->value_)._M_string_length = 0;
  (this->value_).field_2._M_local_buf[0] = '\0';
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  (this->domain_)._M_dataplus._M_p = (pointer)&(this->domain_).field_2;
  (this->domain_)._M_string_length = 0;
  (this->domain_).field_2._M_local_buf[0] = '\0';
  (this->comment_)._M_dataplus._M_p = (pointer)&(this->comment_).field_2;
  (this->comment_)._M_string_length = 0;
  (this->comment_).field_2._M_local_buf[0] = '\0';
  this->field_0xb8 = this->field_0xb8 & 0x80;
  return;
}

Assistant:

cookie::cookie() : secure_(0), has_age_(0), has_expiration_(0), httponly_(0), samesite_none_(0), samesite_lax_(0), samesite_strict_(0) {}